

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

double __thiscall PFData::fileReadPoint(PFData *this,int z,int y,int x)

{
  int iVar1;
  size_t sVar2;
  int in_ESI;
  long in_RDI;
  PFData *unaff_retaddr;
  uint64_t temp;
  uint64_t buf;
  int err;
  double data;
  long offset;
  fpos_t pos;
  uint64_t local_48;
  int local_3c;
  double local_38;
  long local_30;
  fpos_t local_28;
  long lVar3;
  
  lVar3 = in_RDI;
  memset(&local_28,0,0x10);
  fgetpos(*(FILE **)(in_RDI + 0x20),&local_28);
  local_30 = getPointOffset(unaff_retaddr,(int)((ulong)lVar3 >> 0x20),(int)lVar3,in_ESI);
  iVar1 = fseek(*(FILE **)(in_RDI + 0x20),local_30,0);
  if (iVar1 != 0) {
    perror("Error seeking to file");
  }
  local_38 = 0.0;
  local_3c = 0;
  sVar2 = fread(&local_48,8,1,*(FILE **)(in_RDI + 0x20));
  local_3c = (int)sVar2;
  local_38 = (double)bswap64(local_48);
  if (local_3c != 1) {
    perror("Error reading double");
  }
  fsetpos(*(FILE **)(in_RDI + 0x20),&local_28);
  return local_38;
}

Assistant:

double PFData::fileReadPoint(int z, int y, int x){
    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);

    const long offset = getPointOffset(z, y, x);
    if(std::fseek(m_fp, offset, SEEK_SET)){
        std::perror("Error seeking to file");
    }

    double data = 0;
    int err = 0;
    READDOUBLE(data, m_fp, err);
    if(1 != err){
        std::perror("Error reading double");
    }

    //Restore old position
    std::fsetpos(m_fp, &pos);

    return data;
}